

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Benchmark.hpp
# Opt level: O2

void benchmarks::detail::BenchmarkInvoker<long>::
     Invoke<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>,std::function<void(benchmarks::BenchmarkContext&,long)>,benchmarks::BenchmarkContext&>
               (string *name,
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               paramNamesBegin,
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               paramNamesEnd,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *serializedParams,function<void_(benchmarks::BenchmarkContext_&,_long)> *f,
               BenchmarkContext *params)

{
  const_iterator cVar1;
  runtime_error *this;
  invalid_argument *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> param_name;
  long p;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (paramNamesBegin._M_current == paramNamesEnd._M_current) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&param_name,name,": parameters count mismatch!");
    std::runtime_error::runtime_error(this,(string *)&param_name);
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::string((string *)&param_name,(string *)paramNamesBegin._M_current);
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&serializedParams->_M_t,&param_name);
  if ((_Rb_tree_header *)cVar1._M_node != &(serializedParams->_M_t)._M_impl.super__Rb_tree_header) {
    p = BenchmarkParamDeserializer<long>::Deserialize((SerializedParam *)(cVar1._M_node + 2));
    BenchmarkInvoker<>::
    Invoke<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::function<void(benchmarks::BenchmarkContext&,long)>,std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>,benchmarks::BenchmarkContext&,long&>
              (name,paramNamesBegin._M_current + 1,paramNamesEnd,serializedParams,f,params,&p);
    std::__cxx11::string::~string((string *)&param_name);
    return;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::operator+(&local_50,"No argument named ",&param_name);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p,&local_50,
                 " provided!");
  std::invalid_argument::invalid_argument(this_00,(string *)&p);
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

static void Invoke(const std::string& name, ParamNamesIter_ paramNamesBegin, ParamNamesIter_ paramNamesEnd, const SerializedParamsMap_& serializedParams, const Functor_& f, ParamTypes_&&... params)
			{
				if (paramNamesBegin == paramNamesEnd)
					throw std::runtime_error(name + ": parameters count mismatch!");

				auto param_name = *paramNamesBegin;
				auto it = serializedParams.find(param_name);
				if (it == serializedParams.end())
					throw std::invalid_argument("No argument named " + param_name + " provided!");

				BenchmarkParamsHead_ p = BenchmarkParamDeserializer<BenchmarkParamsHead_>::Deserialize(it->second);

				BenchmarkInvoker<BenchmarkParamsTail_...>::Invoke(name, std::next(paramNamesBegin), paramNamesEnd, serializedParams, f, std::forward<ParamTypes_>(params)..., p);
			}